

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O3

double __thiscall
gmlc::utilities::numeric_conversion<double>(utilities *this,string_view V,double defValue)

{
  string_view input;
  double local_8;
  
  input._M_len = (byte *)V._M_len;
  local_8 = defValue;
  if ((this != (utilities *)0x0) && (numCheck[*input._M_len] == '\x01')) {
    input._M_str = (char *)0x0;
    local_8 = strViewToFloat<double>(this,input,(size_t *)numCheck);
  }
  return local_8;
}

Assistant:

X numeric_conversion(std::string_view V, const X defValue)
{
    if (nonNumericFirstCharacter(V)) {
        return defValue;
    }
    try {
        return numConv<X>(V);
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}